

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

bool __thiscall ExpressionValue::operator<=(ExpressionValue *this,ExpressionValue *other)

{
  ExpressionValueCombination EVar1;
  ExpressionValue *other_local;
  ExpressionValue *this_local;
  
  EVar1 = getValueCombination(this->type,other->type);
  switch(EVar1) {
  case II:
    this_local._7_1_ = (this->field_1).intValue <= (other->field_1).intValue;
    break;
  case IF:
    this_local._7_1_ = (double)(this->field_1).intValue <= (other->field_1).floatValue;
    break;
  default:
    this_local._7_1_ = false;
    break;
  case FI:
    this_local._7_1_ = (this->field_1).floatValue <= (double)(other->field_1).intValue;
    break;
  case FF:
    this_local._7_1_ = (this->field_1).floatValue <= (other->field_1).floatValue;
    break;
  case SS:
    this_local._7_1_ = StringLiteral::operator<=(&this->strValue,&other->strValue);
  }
  return this_local._7_1_;
}

Assistant:

bool ExpressionValue::operator<=(const ExpressionValue& other) const
{
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		return intValue <= other.intValue;
	case ExpressionValueCombination::FI:
		return floatValue <= other.intValue;
	case ExpressionValueCombination::IF:
		return intValue <= other.floatValue;
	case ExpressionValueCombination::FF:
		return floatValue <= other.floatValue;
	case ExpressionValueCombination::SS:
		return strValue <= other.strValue;
	default:
		break;
	}

	return false;
}